

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O3

bool __thiscall HPreData::isZeroA(HPreData *this,int i,int j)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  piVar4 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar4[i];
  iVar3 = piVar4[(long)i + 1];
  lVar8 = (long)iVar2;
  iVar7 = iVar2;
  if (piVar5[lVar8] != j) {
    iVar7 = iVar3;
    if (iVar3 < iVar2) {
      iVar7 = iVar2;
    }
    lVar9 = 0;
    do {
      if (iVar7 - lVar8 == lVar9) goto LAB_0014b95c;
      lVar1 = lVar9 + 1;
      lVar6 = lVar9 + 1;
      lVar9 = lVar1;
    } while (piVar5[lVar8 + lVar6] != j);
    iVar7 = iVar2 + (int)lVar1;
  }
LAB_0014b95c:
  return iVar7 == iVar3;
}

Assistant:

bool HPreData::isZeroA(int i, int j) {
	int k=ARstart[i];
    while (j != ARindex[k] && k<ARstart[i+1])
            k++;
    if (k==ARstart[i+1]) {
    	return true;
    	}
    return false;
}